

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::callAfterParsing
          (MainBuilder *this,Function<kj::MainBuilder::Validity_()> *callback)

{
  bool bVar1;
  Impl *pIVar2;
  Function<kj::MainBuilder::Validity_()> *other;
  Fault local_38;
  Fault f_1;
  Fault local_20;
  Fault f;
  Function<kj::MainBuilder::Validity_()> *callback_local;
  MainBuilder *this_local;
  
  f.exception = (Exception *)callback;
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  bVar1 = Maybe<kj::Function<kj::MainBuilder::Validity_()>_>::operator==
                    (&pIVar2->finalCallback,(void *)0x0);
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,399,FAILED,"impl->finalCallback == nullptr",
               "\"callAfterParsing() can only be called once\"",
               (char (*) [43])"callAfterParsing() can only be called once");
    _::Debug::Fault::fatal(&local_20);
  }
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  bVar1 = ::std::
          map<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>_>_>
          ::empty(&pIVar2->subCommands);
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,400,FAILED,"impl->subCommands.empty()",
               "\"cannot have a final callback when accepting sub-commands\"",
               (char (*) [57])"cannot have a final callback when accepting sub-commands");
    _::Debug::Fault::fatal(&local_38);
  }
  other = mv<kj::Function<kj::MainBuilder::Validity()>>(callback);
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  Maybe<kj::Function<kj::MainBuilder::Validity_()>_>::operator=(&pIVar2->finalCallback,other);
  return this;
}

Assistant:

MainBuilder& MainBuilder::callAfterParsing(Function<Validity()> callback) {
  KJ_REQUIRE(impl->finalCallback == nullptr, "callAfterParsing() can only be called once");
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have a final callback when accepting sub-commands");
  impl->finalCallback = kj::mv(callback);
  return *this;
}